

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timeline.hpp
# Opt level: O0

bool ableton::link::operator==(Timeline *lhs,Timeline *rhs)

{
  bool bVar1;
  tuple<const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  local_48;
  tuple<const_ableton::link::Tempo_&,_const_ableton::link::Beats_&,_const_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_&>
  local_30;
  Timeline *local_18;
  Timeline *rhs_local;
  Timeline *lhs_local;
  
  local_18 = rhs;
  rhs_local = lhs;
  std::
  tie<ableton::link::Tempo_const,ableton::link::Beats_const,std::chrono::duration<long,std::ratio<1l,1000000l>>const>
            (&local_30,&lhs->tempo,&lhs->beatOrigin,&lhs->timeOrigin);
  std::
  tie<ableton::link::Tempo_const,ableton::link::Beats_const,std::chrono::duration<long,std::ratio<1l,1000000l>>const>
            (&local_48,&local_18->tempo,&local_18->beatOrigin,&local_18->timeOrigin);
  bVar1 = std::operator==(&local_30,&local_48);
  return bVar1;
}

Assistant:

bool operator==(const Timeline& lhs, const Timeline& rhs)
  {
    return std::tie(lhs.tempo, lhs.beatOrigin, lhs.timeOrigin)
           == std::tie(rhs.tempo, rhs.beatOrigin, rhs.timeOrigin);
  }